

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__create_png_alpha_expand8(stbi_uc *dest,stbi_uc *src,stbi__uint32 x,int img_n)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  stbi_uc *psVar4;
  uint uVar5;
  
  if (img_n == 1) {
    if (-1 < (int)(x - 1)) {
      lVar2 = (ulong)(x - 1) + 1;
      do {
        dest[lVar2 * 2 + -1] = 0xff;
        dest[lVar2 * 2 + -2] = src[lVar2 + -1];
        lVar3 = lVar2 + -1;
        bVar1 = 0 < lVar2;
        lVar2 = lVar3;
      } while (lVar3 != 0 && bVar1);
    }
  }
  else {
    if (img_n != 3) {
      __assert_fail("img_n == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                    ,0x124d,
                    "void stbi__create_png_alpha_expand8(stbi_uc *, stbi_uc *, stbi__uint32, int)");
    }
    uVar5 = x - 1;
    if (-1 < (int)uVar5) {
      psVar4 = src + (ulong)uVar5 * 3 + 2;
      lVar2 = (ulong)uVar5 + 1;
      do {
        dest[lVar2 * 4 + -1] = 0xff;
        dest[lVar2 * 4 + -2] = *psVar4;
        dest[lVar2 * 4 + -3] = psVar4[-1];
        dest[lVar2 * 4 + -4] = psVar4[-2];
        psVar4 = psVar4 + -3;
        lVar3 = lVar2 + -1;
        bVar1 = 0 < lVar2;
        lVar2 = lVar3;
      } while (lVar3 != 0 && bVar1);
    }
  }
  return;
}

Assistant:

static void stbi__create_png_alpha_expand8(stbi_uc *dest, stbi_uc *src, stbi__uint32 x, int img_n)
{
   int i;
   // must process data backwards since we allow dest==src
   if (img_n == 1) {
      for (i=x-1; i >= 0; --i) {
         dest[i*2+1] = 255;
         dest[i*2+0] = src[i];
      }
   } else {
      STBI_ASSERT(img_n == 3);
      for (i=x-1; i >= 0; --i) {
         dest[i*4+3] = 255;
         dest[i*4+2] = src[i*3+2];
         dest[i*4+1] = src[i*3+1];
         dest[i*4+0] = src[i*3+0];
      }
   }
}